

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall Assimp::IFC::Schema_2x3::IfcLaborResource::IfcLaborResource(IfcLaborResource *this)

{
  *(undefined ***)&this->field_0x1b0 = &PTR__Object_008f50b0;
  *(undefined8 *)&this->field_0x1b8 = 0;
  *(char **)&this->field_0x1c0 = "IfcLaborResource";
  IfcConstructionResource::IfcConstructionResource
            (&this->super_IfcConstructionResource,&PTR_construction_vtable_24__00923130);
  *(undefined8 *)&(this->super_IfcConstructionResource).field_0x180 = 0;
  *(undefined8 *)&this->super_IfcConstructionResource = 0x923028;
  *(undefined8 *)&this->field_0x1b0 = 0x923118;
  *(undefined8 *)&(this->super_IfcConstructionResource).field_0x88 = 0x923050;
  *(undefined8 *)&(this->super_IfcConstructionResource).field_0x98 = 0x923078;
  *(undefined8 *)&(this->super_IfcConstructionResource).field_0xd0 = 0x9230a0;
  (this->super_IfcConstructionResource).
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcConstructionResource,_4UL>._vptr_ObjectHelper =
       (_func_int **)0x9230c8;
  *(undefined8 *)&(this->super_IfcConstructionResource).field_0x178 = 0x9230f0;
  *(undefined1 **)&(this->super_IfcConstructionResource).field_0x188 = &this->field_0x198;
  *(undefined8 *)&this->field_0x190 = 0;
  this->field_0x198 = 0;
  this->field_0x1a8 = 0;
  return;
}

Assistant:

IfcLaborResource() : Object("IfcLaborResource") {}